

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O2

void __thiscall
slang::parsing::Preprocessor::handleProtectLicense
          (Preprocessor *this,Token keyword,PragmaExpressionSyntax *args,
          SmallVectorBase<slang::parsing::Token> *param_3)

{
  size_type sVar1;
  bool bVar2;
  ParenPragmaExpressionSyntax *pPVar3;
  SyntaxNode *pSVar4;
  NameValuePragmaExpressionSyntax *pNVar5;
  PragmaExpressionSyntax *pPVar6;
  SimplePragmaExpressionSyntax *pSVar7;
  Diagnostic *pDVar8;
  not_null<slang::syntax::PragmaExpressionSyntax_*> *this_00;
  string_view sVar9;
  SourceRange SVar10;
  string_view arg;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __y_03;
  Token keyword_local;
  const_iterator __begin2;
  
  keyword_local.info = keyword.info;
  keyword_local._0_8_ = keyword._0_8_;
  if (args == (PragmaExpressionSyntax *)0x0) {
    SVar10 = Token::range(&keyword_local);
  }
  else {
    if (((args->super_SyntaxNode).kind == ParenPragmaExpression) &&
       (pPVar3 = slang::syntax::SyntaxNode::as<slang::syntax::ParenPragmaExpressionSyntax>
                           (&args->super_SyntaxNode), (pPVar3->values).elements.size_ != 0)) {
      pPVar3 = slang::syntax::SyntaxNode::as<slang::syntax::ParenPragmaExpressionSyntax>
                         (&args->super_SyntaxNode);
      __begin2.index = 0;
      sVar1 = (pPVar3->values).elements.size_;
      __begin2.list = &pPVar3->values;
      do {
        if ((__begin2.list == &pPVar3->values) && (__begin2.index == sVar1 + 1 >> 1)) {
          return;
        }
        pSVar4 = &slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
                  iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>::operator*(&__begin2)
                  ->super_SyntaxNode;
        if (pSVar4->kind == NameValuePragmaExpression) {
          pNVar5 = slang::syntax::SyntaxNode::as<slang::syntax::NameValuePragmaExpressionSyntax>
                             (pSVar4);
          sVar9 = Token::valueText(&pNVar5->name);
          __y._M_str = "library";
          __y._M_len = 7;
          bVar2 = std::operator==(sVar9,__y);
          if ((((bVar2) ||
               (__y_00._M_str = "entry", __y_00._M_len = 5, bVar2 = std::operator==(sVar9,__y_00),
               bVar2)) ||
              (__y_01._M_str = "feature", __y_01._M_len = 7, bVar2 = std::operator==(sVar9,__y_01),
              bVar2)) ||
             (__y_02._M_str = "exit", __y_02._M_len = 4, bVar2 = std::operator==(sVar9,__y_02),
             bVar2)) {
            this_00 = &pNVar5->value;
            pPVar6 = not_null<slang::syntax::PragmaExpressionSyntax_*>::get(this_00);
            if ((pPVar6->super_SyntaxNode).kind == SimplePragmaExpression) {
              pSVar4 = &not_null<slang::syntax::PragmaExpressionSyntax_*>::get(this_00)->
                        super_SyntaxNode;
              pSVar7 = slang::syntax::SyntaxNode::as<slang::syntax::SimplePragmaExpressionSyntax>
                                 (pSVar4);
              if ((pSVar7->value).kind == StringLiteral) goto LAB_00186420;
            }
            pSVar4 = &not_null<slang::syntax::PragmaExpressionSyntax_*>::get(this_00)->
                      super_SyntaxNode;
            SVar10 = slang::syntax::SyntaxNode::sourceRange(pSVar4);
            pDVar8 = addDiag(this,(DiagCode)0x1f0004,SVar10);
            goto LAB_0018641b;
          }
          __y_03._M_str = "match";
          __y_03._M_len = 5;
          bVar2 = std::operator==(sVar9,__y_03);
          if (bVar2) {
            pPVar6 = not_null<slang::syntax::PragmaExpressionSyntax_*>::get(&pNVar5->value);
            requireUInt32(this,pPVar6);
          }
          else if (sVar9._M_len != 0) {
            SVar10 = Token::range(&pNVar5->name);
            pDVar8 = addDiag(this,(DiagCode)0x2e0004,SVar10);
            arg = Token::valueText(&keyword_local);
            pDVar8 = Diagnostic::operator<<(pDVar8,arg);
            goto LAB_0018641b;
          }
        }
        else {
          SVar10 = slang::syntax::SyntaxNode::sourceRange(pSVar4);
          pDVar8 = addDiag(this,(DiagCode)0x270004,SVar10);
          sVar9 = Token::valueText(&keyword_local);
LAB_0018641b:
          Diagnostic::operator<<(pDVar8,sVar9);
        }
LAB_00186420:
        __begin2.index = __begin2.index + 1;
      } while( true );
    }
    SVar10 = slang::syntax::SyntaxNode::sourceRange(&args->super_SyntaxNode);
  }
  pDVar8 = addDiag(this,(DiagCode)0x270004,SVar10);
  sVar9 = Token::valueText(&keyword_local);
  Diagnostic::operator<<(pDVar8,sVar9);
  return;
}

Assistant:

void Preprocessor::handleProtectLicense(Token keyword, const PragmaExpressionSyntax* args,
                                        SmallVectorBase<Token>&) {
    if (!args || args->kind != SyntaxKind::ParenPragmaExpression ||
        args->as<ParenPragmaExpressionSyntax>().values.empty()) {
        addDiag(diag::ProtectArgList, args ? args->sourceRange() : keyword.range())
            << keyword.valueText();
        return;
    }

    for (auto arg : args->as<ParenPragmaExpressionSyntax>().values) {
        if (arg->kind != SyntaxKind::NameValuePragmaExpression) {
            addDiag(diag::ProtectArgList, arg->sourceRange()) << keyword.valueText();
            continue;
        }

        auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();
        auto name = nvp.name.valueText();
        if (name == "library"sv || name == "entry"sv || name == "feature"sv || name == "exit"sv) {
            if (nvp.value->kind != SyntaxKind::SimplePragmaExpression ||
                nvp.value->as<SimplePragmaExpressionSyntax>().value.kind !=
                    TokenKind::StringLiteral) {
                addDiag(diag::ExpectedProtectArg, nvp.value->sourceRange()) << name;
            }
        }
        else if (name == "match"sv) {
            requireUInt32(*nvp.value);
        }
        else if (!name.empty()) {
            addDiag(diag::UnknownProtectOption, nvp.name.range()) << keyword.valueText() << name;
        }
    }
}